

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O0

bool CEditor::PopupMenuFile(void *pContext,CUIRect View)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  IClient *this;
  CConfig *pCVar4;
  CEditor *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  char *in_stack_00000020;
  CEditor *pEditor;
  CUIRect Slot;
  CUIRect *in_stack_ffffffffffffff98;
  char *pcVar5;
  CEditor *in_stack_ffffffffffffffa0;
  float Cut;
  CUIRect *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  CEditor *pRect;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  bool bVar6;
  _func_void_char_ptr_int_void_ptr *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  CEditor *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CEditor *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  pRect = in_RDI;
  CUIRect::HSplitTop(in_stack_ffffffffffffffa8,(float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     in_stack_ffffffffffffff98,(CUIRect *)0x217b1b);
  CUIRect::HSplitTop(in_stack_ffffffffffffffa8,(float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                     in_stack_ffffffffffffff98,(CUIRect *)0x217b35);
  pcVar5 = "Creates a new map";
  iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                            in_stack_ffffffffffffffd4,(CUIRect *)pRect,(int)((ulong)in_RDI >> 0x20),
                            in_stack_00000020);
  if (iVar2 == 0) {
    CUIRect::HSplitTop(in_stack_ffffffffffffffa8,(float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                       (CUIRect *)pcVar5,(CUIRect *)0x217bd8);
    CUIRect::HSplitTop(in_stack_ffffffffffffffa8,(float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                       (CUIRect *)pcVar5,(CUIRect *)0x217bf2);
    pcVar5 = "Opens a map for editing";
    iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                              in_stack_ffffffffffffffd4,(CUIRect *)pRect,
                              (int)((ulong)in_RDI >> 0x20),in_stack_00000020);
    if (iVar2 == 0) {
      this = Client(in_RDI);
      iVar2 = IClient::State(this);
      if (iVar2 == 3) {
        CUIRect::HSplitTop(in_stack_ffffffffffffffa8,
                           (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(CUIRect *)pcVar5,
                           (CUIRect *)0x217ce0);
        CUIRect::HSplitTop(in_stack_ffffffffffffffa8,
                           (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(CUIRect *)pcVar5,
                           (CUIRect *)0x217cfa);
        pcVar5 = "Opens the current in game map for editing";
        iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,
                                  (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                  (CUIRect *)pRect,(int)((ulong)in_RDI >> 0x20),in_stack_00000020);
        if (iVar2 != 0) {
          uVar3 = (*(in_RDI->super_IEditor).super_IInterface._vptr_IInterface[4])();
          if ((uVar3 & 1) == 0) {
            LoadCurrentMap(in_stack_ffffffffffffffa0);
          }
          else {
            in_RDI->m_PopupEventType = 2;
            in_RDI->m_PopupEventActivated = 1;
          }
          bVar6 = true;
          goto LAB_002180b0;
        }
      }
      CUIRect::HSplitTop(in_stack_ffffffffffffffa8,(float)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                         ,(CUIRect *)pcVar5,(CUIRect *)0x217d8e);
      CUIRect::HSplitTop(in_stack_ffffffffffffffa8,(float)((ulong)in_stack_ffffffffffffffa0 >> 0x20)
                         ,(CUIRect *)pcVar5,(CUIRect *)0x217da8);
      pcVar5 = "Opens a map and adds everything from that map to the current one";
      iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,
                                in_stack_ffffffffffffffd4,(CUIRect *)pRect,
                                (int)((ulong)in_RDI >> 0x20),in_stack_00000020);
      if (iVar2 == 0) {
        CUIRect::HSplitTop(in_stack_ffffffffffffffa8,
                           (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(CUIRect *)pcVar5,
                           (CUIRect *)0x217e46);
        CUIRect::HSplitTop(in_stack_ffffffffffffffa8,
                           (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(CUIRect *)pcVar5,
                           (CUIRect *)0x217e60);
        pcVar5 = "Saves the current map";
        iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,
                                  (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                  (CUIRect *)pRect,(int)((ulong)in_RDI >> 0x20),in_stack_00000020);
        if (iVar2 == 0) {
          CUIRect::HSplitTop(in_stack_ffffffffffffffa8,
                             (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(CUIRect *)pcVar5,
                             (CUIRect *)0x217f5d);
          Cut = (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
          CUIRect::HSplitTop(in_stack_ffffffffffffffa8,Cut,(CUIRect *)pcVar5,(CUIRect *)0x217f77);
          pcVar5 = "Saves the current map under a new name";
          iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,
                                    (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                    (CUIRect *)pRect,(int)((ulong)in_RDI >> 0x20),in_stack_00000020)
          ;
          if (iVar2 == 0) {
            CUIRect::HSplitTop(in_stack_ffffffffffffffa8,Cut,(CUIRect *)pcVar5,(CUIRect *)0x218012);
            CUIRect::HSplitTop(in_stack_ffffffffffffffa8,Cut,(CUIRect *)pcVar5,(CUIRect *)0x21802c);
            iVar2 = DoButton_MenuItem(this_00,in_stack_ffffffffffffffe0,
                                      (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                      (CUIRect *)pRect,(int)((ulong)in_RDI >> 0x20),
                                      in_stack_00000020);
            if (iVar2 == 0) {
              bVar6 = false;
            }
            else {
              uVar3 = (*(in_RDI->super_IEditor).super_IInterface._vptr_IInterface[4])();
              if ((uVar3 & 1) == 0) {
                pCVar4 = Config(in_RDI);
                pCVar4->m_ClEditor = 0;
              }
              else {
                in_RDI->m_PopupEventType = 0;
                in_RDI->m_PopupEventActivated = 1;
              }
              bVar6 = true;
            }
          }
          else {
            InvokeFileDialog(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb0,(char *)in_RDI,(char *)CallbackSaveMap,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
            bVar6 = true;
          }
        }
        else {
          if ((in_RDI->m_aFileName[0] == '\0') || ((in_RDI->m_ValidSaveFilename & 1U) == 0)) {
            InvokeFileDialog(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffb0,(char *)in_RDI,(char *)CallbackSaveMap,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
          }
          else {
            str_copy((char *)in_stack_ffffffffffffffa0,pcVar5,0);
            in_RDI->m_PopupEventType = 4;
            in_RDI->m_PopupEventActivated = 1;
          }
          bVar6 = true;
        }
      }
      else {
        InvokeFileDialog(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,(char *)in_RDI,(char *)CallbackAppendMap,
                         (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
        bVar6 = true;
      }
    }
    else {
      uVar3 = (*(in_RDI->super_IEditor).super_IInterface._vptr_IInterface[4])();
      if ((uVar3 & 1) == 0) {
        InvokeFileDialog(in_RDI,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0,(char *)in_RDI,(char *)CallbackOpenMap,
                         (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0);
      }
      else {
        in_RDI->m_PopupEventType = 1;
        in_RDI->m_PopupEventActivated = 1;
      }
      bVar6 = true;
    }
  }
  else {
    uVar3 = (*(in_RDI->super_IEditor).super_IInterface._vptr_IInterface[4])();
    if ((uVar3 & 1) == 0) {
      Reset(in_stack_ffffffffffffffa0,SUB81((ulong)pcVar5 >> 0x38,0));
      in_RDI->m_aFileName[0] = '\0';
    }
    else {
      in_RDI->m_PopupEventType = 3;
      in_RDI->m_PopupEventActivated = 1;
    }
    bVar6 = true;
  }
LAB_002180b0:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar6;
}

Assistant:

bool CEditor::PopupMenuFile(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	static int s_NewMapButton = 0;
	static int s_SaveButton = 0;
	static int s_SaveAsButton = 0;
	static int s_OpenButton = 0;
	static int s_OpenCurrentButton = 0;
	static int s_AppendButton = 0;
	static int s_ExitButton = 0;

	CUIRect Slot;
	View.HSplitTop(2.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_NewMapButton, "New", 0, &Slot, 0, "Creates a new map"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_NEW;
			pEditor->m_PopupEventActivated = true;
		}
		else
		{
			pEditor->Reset();
			pEditor->m_aFileName[0] = 0;
		}
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_OpenButton, "Load", 0, &Slot, 0, "Opens a map for editing"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_LOAD;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", pEditor->CallbackOpenMap, pEditor);
		return true;
	}

	if(pEditor->Client()->State() == IClient::STATE_ONLINE)
	{
		View.HSplitTop(2.0f, &Slot, &View);
		View.HSplitTop(12.0f, &Slot, &View);
		if(pEditor->DoButton_MenuItem(&s_OpenCurrentButton, "Load Current Map", 0, &Slot, 0, "Opens the current in game map for editing"))
		{
			if(pEditor->HasUnsavedData())
			{
				pEditor->m_PopupEventType = POPEVENT_LOAD_CURRENT;
				pEditor->m_PopupEventActivated = true;
			}
			else
				pEditor->LoadCurrentMap();
			return true;
		}
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_AppendButton, "Append", 0, &Slot, 0, "Opens a map and adds everything from that map to the current one"))
	{
		pEditor->InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Append map", "Append", "maps", "", pEditor->CallbackAppendMap, pEditor);
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_SaveButton, "Save", 0, &Slot, 0, "Saves the current map"))
	{
		if(pEditor->m_aFileName[0] && pEditor->m_ValidSaveFilename)
		{
			str_copy(pEditor->m_aFileSaveName, pEditor->m_aFileName, sizeof(pEditor->m_aFileSaveName));
			pEditor->m_PopupEventType = POPEVENT_SAVE;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", pEditor->CallbackSaveMap, pEditor);
		return true;
	}

	View.HSplitTop(2.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_SaveAsButton, "Save As", 0, &Slot, 0, "Saves the current map under a new name"))
	{
		pEditor->InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", pEditor->CallbackSaveMap, pEditor);
		return true;
	}

	View.HSplitTop(10.0f, &Slot, &View);
	View.HSplitTop(12.0f, &Slot, &View);
	if(pEditor->DoButton_MenuItem(&s_ExitButton, "Exit", 0, &Slot, 0, "Exits from the editor"))
	{
		if(pEditor->HasUnsavedData())
		{
			pEditor->m_PopupEventType = POPEVENT_EXIT;
			pEditor->m_PopupEventActivated = true;
		}
		else
			pEditor->Config()->m_ClEditor = 0;
		return true;
	}

	return false;
}